

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmParseFileScope::cmParseFileScope(cmParseFileScope *this,cmMakefile *mf)

{
  cmCommandContext *local_18;
  
  this->Makefile = mf;
  (this->Context).Name._M_dataplus._M_p = (pointer)&(this->Context).Name.field_2;
  (this->Context).Name._M_string_length = 0;
  (this->Context).Name.field_2._M_local_buf[0] = '\0';
  (this->Context).Line = 0;
  local_18 = &this->Context;
  std::vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>>::
  emplace_back<cmCommandContext_const*>
            ((vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>> *)
             &mf->ContextStack,&local_18);
  return;
}

Assistant:

cmParseFileScope(cmMakefile* mf)
    : Makefile(mf)
  {
    this->Makefile->ContextStack.push_back(&this->Context);
  }